

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O0

void __thiscall Cgmres<Model>::F_func(Cgmres<Model> *this,double *ret,double *U,double *x,double t)

{
  double *in_RCX;
  long in_RDX;
  long in_RSI;
  double in_RDI;
  uint16_t i_2;
  int16_t i_1;
  uint16_t i;
  double ltau [204];
  double xtau [204];
  double dtau;
  uint16_t idx_p;
  uint16_t idx_u;
  uint16_t idx_x;
  undefined2 in_stack_fffffffffffff300;
  undefined2 in_stack_fffffffffffff302;
  undefined2 in_stack_fffffffffffff304;
  short sVar1;
  undefined2 in_stack_fffffffffffff306;
  ushort uVar2;
  double local_cf8 [200];
  double adStack_6b8 [4];
  double local_698 [200];
  double adStack_58 [4];
  double local_38;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  double *local_20;
  long local_18;
  long local_10;
  
  if (in_RSI == in_RDX) {
    printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n","F_func"
          );
    exit(-1);
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = get_dtau((Cgmres<Model> *)
                      CONCAT26(in_stack_fffffffffffff306,
                               CONCAT24(in_stack_fffffffffffff304,
                                        CONCAT22(in_stack_fffffffffffff302,in_stack_fffffffffffff300
                                                ))),in_RDI);
  mov(local_698,local_20,4);
  for (uVar2 = 0; uVar2 < 0x32; uVar2 = uVar2 + 1) {
    local_2a = uVar2 << 2;
    local_2c = uVar2 * 6;
    local_2e = uVar2 << 1;
    Model::dxdt(local_698 + (int)(local_2a + 4),local_698 + local_2a,
                (double *)(local_18 + (ulong)local_2c * 8),
                (double *)(*(long *)((long)in_RDI + 0x60) + (ulong)local_2e * 8));
    mul(local_698 + (int)(local_2a + 4),local_698 + (int)(local_2a + 4),local_38,4);
    add(local_698 + (int)(local_2a + 4),local_698 + (int)(local_2a + 4),local_698 + local_2a,4);
  }
  Model::dPhidx(adStack_6b8,adStack_58,(double *)(*(long *)((long)in_RDI + 0x60) + 800));
  for (sVar1 = 0x31; -1 < sVar1; sVar1 = sVar1 + -1) {
    local_2a = sVar1 << 2;
    local_2c = sVar1 * 6;
    local_2e = sVar1 << 1;
    Model::dHdx(local_cf8 + local_2a,local_698 + local_2a,(double *)(local_18 + (ulong)local_2c * 8)
                ,(double *)(*(long *)((long)in_RDI + 0x60) + (ulong)local_2e * 8),
                local_cf8 + (int)(local_2a + 4));
    mul(local_cf8 + local_2a,local_cf8 + local_2a,local_38,4);
    add(local_cf8 + local_2a,local_cf8 + local_2a,local_cf8 + (int)(local_2a + 4),4);
  }
  for (uVar2 = 0; uVar2 < 0x32; uVar2 = uVar2 + 1) {
    local_2a = uVar2 << 2;
    local_2c = uVar2 * 6;
    local_2e = uVar2 << 1;
    Model::dHdu((double *)(local_10 + (ulong)local_2c * 8),local_698 + local_2a,
                (double *)(local_18 + (ulong)local_2c * 8),
                (double *)(*(long *)((long)in_RDI + 0x60) + (ulong)local_2e * 8),
                local_cf8 + (int)(local_2a + 4));
  }
  return;
}

Assistant:

void F_func(double* ret, const double* U, const double* x, const double t) const {
    uint16_t idx_x, idx_u, idx_p;
    double dtau;
    double xtau[dim_x * (dv + 1)];
    double ltau[dim_x * (dv + 1)];

#ifdef DEBUG_MODE
    if (ret == U) {
      printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n", __func__);
      exit(-1);
    }
#endif

    // Prediction horizon
    dtau = get_dtau(t);

    // State equation
    // x(0) = x
    // x(i + 1) = x(i) + dxdt(x(i), u(i), p(i)) * dtau
    mov(&xtau[0], x, dim_x);
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dxdt(&xtau[idx_x + dim_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p]);
      mul(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], dtau, dim_x);
      add(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], &xtau[idx_x], dim_x);
    }

    // Adjoint equation
    // lmd(N) = dPhidx(x(N), p(N))
    // lmd(i) = lmd(i + 1) + dHdx(x(i), u(i), p(i), lmd(i + 1)) * dtau
    Model::dPhidx(&ltau[dim_x * dv], &xtau[dim_x * dv], &ptau[dim_p * dv]);
    for (int16_t i = dv - 1; i >= 0; i--) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdx(&ltau[idx_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
      mul(&ltau[idx_x], &ltau[idx_x], dtau, dim_x);
      add(&ltau[idx_x], &ltau[idx_x], &ltau[idx_x + dim_x], dim_x);
    }

    // F(i) = dHdU(x(i), u(i), lmd(i + 1))
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdu(&ret[idx_u], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
    }
  }